

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O1

Quaternion ConvexDecomposition::normalize(Quaternion a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined1 auVar4 [64];
  undefined8 uVar5;
  undefined1 auVar6 [64];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  Quaternion QVar11;
  
  auVar6._8_56_ = a._16_56_;
  auVar6._0_8_ = a.super_float4._8_8_;
  auVar4._8_56_ = a._8_56_;
  auVar4._0_8_ = a.super_float4._0_8_;
  auVar1 = vmovshdup_avx(auVar4._0_16_);
  auVar2 = vmovshdup_avx(auVar6._0_16_);
  fVar8 = auVar2._0_4_;
  fVar9 = a.super_float4.x;
  fVar10 = auVar1._0_4_;
  fVar7 = a.super_float4.z * a.super_float4.z + fVar10 * fVar10 + fVar9 * fVar9 + fVar8 * fVar8;
  if (fVar7 < 0.0) {
    fVar7 = sqrtf(fVar7);
    auVar6 = ZEXT1664(auVar6._0_16_);
  }
  else {
    auVar1 = vsqrtss_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar7));
    fVar7 = auVar1._0_4_;
  }
  if (1e-09 <= fVar7) {
    fVar7 = 1.0 / fVar7;
    auVar1 = vinsertps_avx(ZEXT416((uint)(fVar9 * fVar7)),ZEXT416((uint)(fVar10 * fVar7)),0x10);
    uVar3 = auVar1._0_8_;
    auVar1 = vinsertps_avx(ZEXT416((uint)(auVar6._0_4_ * fVar7)),ZEXT416((uint)(fVar8 * fVar7)),0x10
                          );
    uVar5 = auVar1._0_8_;
  }
  else {
    uVar5 = 0x3f80000000000000;
    uVar3 = 0;
  }
  QVar11.super_float4.z = (float)(int)uVar5;
  QVar11.super_float4.w = (float)(int)((ulong)uVar5 >> 0x20);
  QVar11.super_float4.x = (float)(int)uVar3;
  QVar11.super_float4.y = (float)(int)((ulong)uVar3 >> 0x20);
  return (Quaternion)QVar11.super_float4;
}

Assistant:

Quaternion normalize( Quaternion a )
{
	float m = sqrtf(sqr(a.w)+sqr(a.x)+sqr(a.y)+sqr(a.z));
	if(m<0.000000001) 
		{    
		a.w=1;
		a.x=a.y=a.z=0;
		return a;
	}
	return a * (1/m);
}